

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  UnitTest *pUVar3;
  TestEventListeners *this_00;
  TestEventListener *pTVar4;
  iterator iVar5;
  iterator iVar6;
  TestResult *pTVar7;
  TimeInMillis TVar8;
  TestInfo *pTVar9;
  bool local_71;
  int local_58;
  int local_54;
  int j;
  int i;
  Timer timer;
  bool skip_all;
  TestEventListener *repeater;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) == 0) {
    return;
  }
  pUVar3 = UnitTest::GetInstance();
  UnitTest::set_current_test_suite(pUVar3,this);
  pUVar3 = UnitTest::GetInstance();
  this_00 = UnitTest::listeners(pUVar3);
  pTVar4 = TestEventListeners::repeater(this_00);
  iVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                    (&this->test_info_list_);
  iVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
                    (&this->test_info_list_);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestSuite::Run()::__0>
            (iVar5._M_current,iVar6._M_current);
  (*pTVar4->_vptr_TestEventListener[6])(pTVar4,this);
  (*pTVar4->_vptr_TestEventListener[7])(pTVar4,this);
  pUVar3 = UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(pUVar3);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x35c240,(char *)0x0);
  pTVar7 = ad_hoc_test_result(this);
  bVar1 = TestResult::Failed(pTVar7);
  local_71 = true;
  if (!bVar1) {
    pTVar7 = ad_hoc_test_result(this);
    local_71 = TestResult::Skipped(pTVar7);
  }
  timer.start_.__d.__r._7_1_ = local_71;
  TVar8 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar8;
  internal::Timer::Timer((Timer *)&j);
  for (local_54 = 0; iVar2 = total_test_count(this), local_54 < iVar2; local_54 = local_54 + 1) {
    if ((timer.start_.__d.__r._7_1_ & 1) == 0) {
      pTVar9 = GetMutableTestInfo(this,local_54);
      TestInfo::Run(pTVar9);
    }
    else {
      pTVar9 = GetMutableTestInfo(this,local_54);
      TestInfo::Skip(pTVar9);
    }
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      pTVar9 = GetMutableTestInfo(this,local_54);
      pTVar7 = TestInfo::result(pTVar9);
      bVar1 = TestResult::Failed(pTVar7);
      local_58 = local_54;
      if (bVar1) goto LAB_0033db7e;
    }
  }
LAB_0033dbc7:
  TVar8 = internal::Timer::Elapsed((Timer *)&j);
  this->elapsed_time_ = TVar8;
  pUVar3 = UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(pUVar3);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x35c290,(char *)0x0);
  (*pTVar4->_vptr_TestEventListener[0xc])(pTVar4,this);
  (*pTVar4->_vptr_TestEventListener[0xd])(pTVar4,this);
  pUVar3 = UnitTest::GetInstance();
  UnitTest::set_current_test_suite(pUVar3,(TestSuite *)0x0);
  return;
LAB_0033db7e:
  while( true ) {
    local_58 = local_58 + 1;
    iVar2 = total_test_count(this);
    if (iVar2 <= local_58) break;
    pTVar9 = GetMutableTestInfo(this,local_58);
    TestInfo::Skip(pTVar9);
  }
  goto LAB_0033dbc7;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}